

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_ssls.c
# Opt level: O3

CURLcode tool_ssls_exp(CURL *easy,void *userptr,char *session_key,uchar *shmac,size_t shmac_len,
                      uchar *sdata,size_t sdata_len,curl_off_t valid_until,int ietf_tls_id,
                      char *alpn,size_t earlydata_max)

{
  CURLcode CVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  char *local_40;
  size_t local_38;
  
  local_40 = (char *)0x0;
  if (*(int *)((long)userptr + 0x10) == 0) {
    fputs("# Your SSL session cache. https://curl.se/docs/ssl-sessions.html\n# This file was generated by libcurl! Edit at your own risk.\n"
          ,*(FILE **)((long)userptr + 8));
  }
  CVar1 = curlx_base64_encode((char *)shmac,shmac_len,&local_40,&local_38);
  sVar4 = local_38;
  if (CVar1 == CURLE_OK) {
    sVar3 = fwrite(local_40,1,local_38,*(FILE **)((long)userptr + 8));
    uVar5 = 0x17;
    if (sVar4 == sVar3) {
      iVar2 = fputc(0x3a,*(FILE **)((long)userptr + 8));
      if (iVar2 != -1) {
        curl_free(local_40);
        CVar1 = curlx_base64_encode((char *)sdata,sdata_len,&local_40,&local_38);
        if (CVar1 != CURLE_OK) goto LAB_0011d2d0;
        sVar4 = fwrite(local_40,1,local_38,*(FILE **)((long)userptr + 8));
        if (local_38 == sVar4) {
          iVar2 = fputc(10,*(FILE **)((long)userptr + 8));
          if (iVar2 != -1) {
            *(int *)((long)userptr + 0x10) = *(int *)((long)userptr + 0x10) + 1;
            CVar1 = CURLE_OK;
            goto LAB_0011d38a;
          }
        }
      }
    }
  }
  else {
LAB_0011d2d0:
    uVar5 = (ulong)CVar1;
  }
  CVar1 = (CURLcode)uVar5;
  warnf(*userptr,"Warning: error saving SSL session for \'%s\': %d",session_key,uVar5);
LAB_0011d38a:
  curl_free(local_40);
  return CVar1;
}

Assistant:

static CURLcode tool_ssls_exp(CURL *easy, void *userptr,
                              const char *session_key,
                              const unsigned char *shmac, size_t shmac_len,
                              const unsigned char *sdata, size_t sdata_len,
                              curl_off_t valid_until, int ietf_tls_id,
                              const char *alpn, size_t earlydata_max)
{
  struct tool_ssls_ctx *ctx = userptr;
  char *enc = NULL;
  size_t enc_len;
  CURLcode r;

  (void)easy;
  (void)valid_until;
  (void)ietf_tls_id;
  (void)alpn;
  (void)earlydata_max;
  if(!ctx->exported)
    fputs("# Your SSL session cache. https://curl.se/docs/ssl-sessions.html\n"
        "# This file was generated by libcurl! Edit at your own risk.\n",
        ctx->fp);

  r = curlx_base64_encode((const char *)shmac, shmac_len, &enc, &enc_len);
  if(r)
    goto out;
  r = CURLE_WRITE_ERROR;
  if(enc_len != fwrite(enc, 1, enc_len, ctx->fp))
    goto out;
  if(EOF == fputc(':', ctx->fp))
    goto out;
  curl_free(enc);
  r = curlx_base64_encode((const char *)sdata, sdata_len, &enc, &enc_len);
  if(r)
    goto out;
  r = CURLE_WRITE_ERROR;
  if(enc_len != fwrite(enc, 1, enc_len, ctx->fp))
    goto out;
  if(EOF == fputc('\n', ctx->fp))
    goto out;
  r = CURLE_OK;
  ctx->exported++;
out:
  if(r)
    warnf(ctx->global, "Warning: error saving SSL session for '%s': %d",
          session_key, r);
  curl_free(enc);
  return r;
}